

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsGetPropertyCommon(ScriptContext *scriptContext,RecyclableObject *object,
                   PropertyRecord *propertyRecord,JsValueRef *value)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Var instance;
  undefined7 extraout_var;
  
  if (scriptContext->threadContext->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x604,"(scriptContext->GetThreadContext()->IsScriptActive())",
                       "Caller is expected to be under ContextAPIWrapper!");
    if (!bVar2) goto LAB_00386ec8;
    *puVar4 = 0;
  }
  instance = Js::JavascriptOperators::GetPropertyNoCache(object,propertyRecord->pid,scriptContext);
  *value = instance;
  if (instance != (Var)0x0) {
    uVar3 = Js::CrossSite::NeedMarshalVar(instance,scriptContext);
    instance = (Var)(ulong)uVar3;
    if (uVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x607,
                         "(*value == nullptr || !Js::CrossSite::NeedMarshalVar(*value, scriptContext))"
                         ,
                         "*value == nullptr || !Js::CrossSite::NeedMarshalVar(*value, scriptContext)"
                        );
      instance = (Var)CONCAT71(extraout_var,bVar2);
      if (!bVar2) {
LAB_00386ec8:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return (JsErrorCode)instance;
}

Assistant:

static JsErrorCode JsGetPropertyCommon(Js::ScriptContext * scriptContext,
    _In_ Js::RecyclableObject * object,
    _In_ const Js::PropertyRecord * propertyRecord, _Out_ JsValueRef *value)
{
    AssertMsg(scriptContext->GetThreadContext()->IsScriptActive(), "Caller is expected to be under ContextAPIWrapper!");

    *value = Js::JavascriptOperators::GetPropertyNoCache(object, propertyRecord->GetPropertyId(), scriptContext);
    Assert(*value == nullptr || !Js::CrossSite::NeedMarshalVar(*value, scriptContext));

    return JsNoError;
}